

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

bool __thiscall
glcts::GeometryShaderMaxInputComponentsTest::verifyResult
          (GeometryShaderMaxInputComponentsTest *this,void *data)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  GLint expected_data;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar2 = ((this->m_max_geometry_input_components + 1) * this->m_max_geometry_input_components) / 2;
  iVar1 = *data;
  if (iVar1 != iVar2) {
    local_1a8._0_8_ =
         ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Wrong result! Expected: ",0x18);
    std::ostream::operator<<(this_00,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Extracted: ",0xc);
    std::ostream::operator<<(this_00,*data);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  return iVar1 == iVar2;
}

Assistant:

bool GeometryShaderMaxInputComponentsTest::verifyResult(const void* data)
{
	/* Expected data, sum of elements in range <x;y> with length n = ((x + y) / 2) * n */
	const glw::GLint expected_data = ((1 + m_max_geometry_input_components) * m_max_geometry_input_components) / 2;

	/* Cast to const GLint */
	const glw::GLint* transform_feedback_data = (const glw::GLint*)data;

	/* Verify data extracted from transfrom feedback */
	if (0 != memcmp(transform_feedback_data, &expected_data, m_buffer_size))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_data
						   << " Extracted: " << *transform_feedback_data << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}